

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<only_assigned_on_reset::AlwaysFFVisitor,_true,_true,_false,_false>::
visitDefault<slang::ast::PropertySymbol>
          (ASTVisitor<only_assigned_on_reset::AlwaysFFVisitor,_true,_true,_false,_false> *this,
          PropertySymbol *t)

{
  bool bVar1;
  iterator this_00;
  iterator visitor;
  DeclaredType *in_RSI;
  AlwaysFFVisitor *in_RDI;
  Symbol *member;
  iterator __end0;
  iterator __begin0;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range4;
  Expression *init;
  DeclaredType *declaredType;
  Symbol *in_stack_ffffffffffffffb0;
  Symbol *in_stack_ffffffffffffffb8;
  Scope *in_stack_ffffffffffffffc0;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_38;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_28;
  Expression *local_20;
  DeclaredType *local_18;
  
  local_18 = Symbol::getDeclaredType(in_stack_ffffffffffffffb8);
  if ((local_18 != (DeclaredType *)0x0) &&
     (local_20 = DeclaredType::getInitializer(in_RSI), local_20 != (Expression *)0x0)) {
    Expression::visit<only_assigned_on_reset::AlwaysFFVisitor&>
              ((Expression *)in_stack_ffffffffffffffb0,in_RDI);
  }
  local_38 = Scope::members(in_stack_ffffffffffffffc0);
  local_28 = &local_38;
  this_00 = std::ranges::
            subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
            ::begin(local_28);
  visitor = std::ranges::
            subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
            ::end(local_28);
  while (bVar1 = operator==<slang::ast::Scope::iterator>
                           ((self_type *)in_stack_ffffffffffffffb0,(iterator *)in_RDI),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    in_stack_ffffffffffffffb0 =
         iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                   ((iterator_facade<slang::ast::Scope::iterator,_false> *)0x1f24f6);
    Symbol::visit<only_assigned_on_reset::AlwaysFFVisitor&>
              (this_00.current,(AlwaysFFVisitor *)visitor.current);
    iterator_facade<slang::ast::Scope::iterator,_false>::operator++<slang::ast::Scope::iterator>
              ((iterator_facade<slang::ast::Scope::iterator,_false> *)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void visitDefault(const T& t) {
        if constexpr (VisitExpressions && HasVisitExprs<T, TDerived>) {
            t.visitExprs(DERIVED);
        }
        else if constexpr (VisitExpressions && std::is_base_of_v<Symbol, T>) {
            if (auto declaredType = t.getDeclaredType()) {
                if (auto init = declaredType->getInitializer())
                    init->visit(DERIVED);
            }
        }

        if constexpr (VisitStatements && requires { t.visitStmts(DERIVED); }) {
            t.visitStmts(DERIVED);
        }

        if constexpr (std::is_base_of_v<GenericClassDefSymbol, T>) {
            for (auto&& spec : t.specializations())
                spec.visit(DERIVED);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            for (auto& member : t.members())
                member.visit(DERIVED);
        }

        if constexpr (std::is_same_v<InstanceSymbol, T>) {
            if constexpr (VisitCanonical) {
                const auto& body = t.getCanonicalBody() ? *t.getCanonicalBody() : t.body;
                body.visit(DERIVED);
            }
            else {
                t.body.visit(DERIVED);
            }
        }

        if constexpr (std::is_same_v<CheckerInstanceSymbol, T>) {
            t.body.visit(DERIVED);
        }
    }